

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

void __thiscall HACD::HACD::InitializeDualGraph(HACD *this)

{
  undefined8 *puVar1;
  Vec3<long> *pVVar2;
  pointer pGVar3;
  Vec3<double> *pVVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  Vec3<double> *pVVar15;
  ulong uVar16;
  double *pdVar17;
  ICHUll *this_00;
  size_t sVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  long lVar22;
  undefined1 auVar23 [16];
  double n;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM6 [16];
  long hitTriangle;
  Vec3<double> hitNormal;
  Vec3<double> hitPoint;
  Float dist;
  RaycastMesh rm;
  char msg [1024];
  ulong local_5c0;
  undefined1 local_5b8 [24];
  ulong local_5a0;
  double local_598;
  ulong local_590;
  ulong local_588;
  undefined8 uStack_580;
  undefined1 local_578 [16];
  double local_568;
  double local_558;
  double local_550;
  long local_548;
  long local_540;
  long local_538;
  long local_530;
  long local_528;
  double local_520;
  undefined1 local_518 [16];
  DPoint local_500;
  Vec3<double> local_4e8;
  Vec3<double> local_4d0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  Float local_4a8;
  RaycastMesh local_4a0;
  char local_438 [1032];
  
  pVVar15 = this->m_normals;
  if (pVVar15 != (Vec3<double> *)0x0) {
    operator_delete__(pVVar15[-1].m_data + 2,(long)pVVar15[-1].m_data[2] * 0x18 + 8);
  }
  uVar16 = this->m_nPoints;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar16;
  uVar12 = SUB168(auVar23 * ZEXT816(0x18),0);
  uVar13 = uVar12 + 8;
  if (0xfffffffffffffff7 < uVar12) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar23 * ZEXT816(0x18),8) == 0) {
    uVar12 = uVar13;
  }
  puVar14 = (ulong *)operator_new__(uVar12);
  *puVar14 = uVar16;
  pVVar15 = (Vec3<double> *)(puVar14 + 1);
  this->m_normals = pVVar15;
  if (this->m_addFacesPoints == true) {
    pVVar15 = this->m_facePoints;
    if (pVVar15 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar15[-1].m_data + 2,(long)pVVar15[-1].m_data[2] * 0x18 + 8);
    }
    pVVar15 = this->m_faceNormals;
    if (pVVar15 != (Vec3<double> *)0x0) {
      operator_delete__(pVVar15[-1].m_data + 2,(long)pVVar15[-1].m_data[2] * 0x18 + 8);
    }
    uVar16 = this->m_nTriangles;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar16;
    uVar12 = SUB168(auVar5 * ZEXT816(0x18),0);
    uVar13 = uVar12 + 8;
    if (0xfffffffffffffff7 < uVar12) {
      uVar13 = 0xffffffffffffffff;
    }
    uVar12 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
      uVar12 = uVar13;
    }
    puVar14 = (ulong *)operator_new__(uVar12);
    *puVar14 = uVar16;
    this->m_facePoints = (Vec3<double> *)(puVar14 + 1);
    puVar14 = (ulong *)operator_new__(uVar12);
    *puVar14 = uVar16;
    this->m_faceNormals = (Vec3<double> *)(puVar14 + 1);
    pVVar15 = this->m_normals;
    uVar16 = this->m_nPoints;
  }
  memset(pVVar15,0,uVar16 * 0x18);
  RaycastMesh::RaycastMesh(&local_4a0);
  if (this->m_addExtraDistPoints == false) {
    dVar24 = (double)this->m_nTriangles;
  }
  else {
    RaycastMesh::Initialize
              (&local_4a0,this->m_nPoints,this->m_nTriangles,this->m_points,this->m_triangles,0xf,4,
               2.0);
    dVar24 = (double)this->m_nTriangles;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar24;
    uVar16 = SUB168(auVar6 * ZEXT816(0x18),0);
    uVar12 = uVar16 + 8;
    if (0xfffffffffffffff7 < uVar16) {
      uVar12 = 0xffffffffffffffff;
    }
    if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    pdVar17 = (double *)operator_new__(uVar12);
    *pdVar17 = dVar24;
    this->m_extraDistPoints = (Vec3<double> *)(pdVar17 + 1);
    pdVar17 = (double *)operator_new__(uVar12);
    *pdVar17 = dVar24;
    this->m_extraDistNormals = (Vec3<double> *)(pdVar17 + 1);
  }
  this->m_area = 0.0;
  if (dVar24 == 0.0) {
    dVar24 = 0.0;
  }
  else {
    lVar19 = 0x10;
    uVar16 = 0xffffffffffffffff;
    lVar22 = 0x278;
    dVar21 = 0.0;
    local_558 = -1.0;
    local_4b8 = 0x4008000000000000;
    uStack_4b0 = 0x4008000000000000;
    do {
      auVar23 = vcvtusi2sd_avx512f(in_XMM6,dVar21);
      auVar5 = vcvtusi2sd_avx512f(in_XMM6,dVar24);
      dVar24 = (auVar23._0_8_ * 100.0) / auVar5._0_8_;
      auVar7._8_8_ = 0x7fffffffffffffff;
      auVar7._0_8_ = 0x7fffffffffffffff;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar24 - local_558;
      auVar23 = vandpd_avx512vl(auVar28,auVar7);
      local_590 = uVar16;
      if ((1.0 < auVar23._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
        sprintf(local_438,"%3.2f %% \t \t \r");
        (*this->m_callBack)(local_438,dVar24,0.0,this->m_nTriangles);
        local_558 = dVar24;
      }
      pVVar2 = this->m_triangles;
      local_5a0 = *(ulong *)((long)pVVar2->m_data + lVar19 + -0x10);
      uVar16 = *(ulong *)((long)pVVar2->m_data + lVar19 + -8);
      local_5c0 = *(ulong *)((long)pVVar2->m_data + lVar19);
      local_5b8._8_8_ = 0;
      local_5b8._0_8_ = local_5a0;
      local_5b8._16_8_ = local_5b8._16_8_ & 0xffffffffffff0000;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)(this->m_graph).m_vertices.
                        super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar22 + -0x1b0),
                 (DPoint *)local_5b8);
      local_5b8._8_8_ = 0;
      local_5b8._0_8_ = uVar16;
      local_5b8._16_8_ = local_5b8._16_8_ & 0xffffffffffff0000;
      local_588 = uVar16;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)(this->m_graph).m_vertices.
                        super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar22 + -0x1b0),
                 (DPoint *)local_5b8);
      local_5b8._8_8_ = 0;
      local_5b8._0_8_ = local_5c0;
      local_5b8._16_8_ = local_5b8._16_8_ & 0xffffffffffff0000;
      SArray<HACD::DPoint,_16UL>::PushBack
                ((SArray<HACD::DPoint,_16UL> *)
                 ((long)(this->m_graph).m_vertices.
                        super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar22 + -0x1b0),
                 (DPoint *)local_5b8);
      uVar16 = local_5a0;
      this_00 = (ICHUll *)::operator_new(0x110);
      ICHUll::ICHUll(this_00,this->m_heapManager);
      *(ICHUll **)
       ((long)(((this->m_graph).m_vertices.
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start)->m_edges).m_data0 + lVar22 + -0x18) = this_00;
      local_538 = uVar16 * 3;
      ICHUll::AddPoint(this_00,this->m_points + uVar16,uVar16);
      local_540 = local_588 * 3;
      ICHUll::AddPoint(this_00,this->m_points + local_588,local_588);
      local_548 = local_5c0 * 3;
      ICHUll::AddPoint(this_00,this->m_points + local_5c0,local_5c0);
      uVar12 = local_588;
      this_00->m_distPoints =
           (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
            *)0x0;
      pVVar15 = this->m_points;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = pVVar15[uVar16].m_data[0];
      auVar43._8_8_ = pVVar15[uVar16].m_data[2];
      auVar43._0_8_ = pVVar15[uVar16].m_data[2];
      auVar5 = vsubpd_avx(*(undefined1 (*) [16])(pVVar15[local_588].m_data + 1),
                          *(undefined1 (*) [16])(pVVar15[uVar16].m_data + 1));
      auVar6 = vunpcklpd_avx(auVar43,auVar29);
      dVar24 = pVVar15[local_5c0].m_data[1] -
               SUB168(*(undefined1 (*) [16])(pVVar15[uVar16].m_data + 1),0);
      in_ZMM2 = ZEXT864((ulong)dVar24);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pVVar15[local_5c0].m_data[2];
      auVar23 = vmovhpd_avx(auVar39,pVVar15[local_5c0].m_data[0]);
      auVar6 = vsubpd_avx(auVar23,auVar6);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = pVVar15[local_588].m_data[0] - pVVar15[uVar16].m_data[0];
      auVar23 = vshufpd_avx(auVar5,auVar25,1);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar24;
      auVar7 = vunpcklpd_avx(auVar34,auVar6);
      auVar40._0_8_ = auVar7._0_8_ * auVar23._0_8_;
      auVar40._8_8_ = auVar7._8_8_ * auVar23._8_8_;
      local_518 = vfmsub231pd_fma(auVar40,auVar5,auVar6);
      auVar23 = vshufpd_avx(auVar6,auVar6,1);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar23._0_8_ * auVar5._0_8_;
      auVar5 = vfmsub231sd_fma(auVar37,auVar25,auVar34);
      local_550 = auVar5._0_8_;
      pVVar15 = this->m_normals;
      dVar24 = pVVar15[uVar16].m_data[1];
      dVar38 = local_518._0_8_;
      dVar42 = local_518._8_8_;
      pVVar15[uVar16].m_data[0] = dVar38 + pVVar15[uVar16].m_data[0];
      pVVar15[uVar16].m_data[1] = dVar42 + dVar24;
      pVVar15[uVar16].m_data[2] = local_550 + pVVar15[uVar16].m_data[2];
      dVar24 = pVVar15[local_588].m_data[1];
      pVVar15[local_588].m_data[0] = dVar38 + pVVar15[local_588].m_data[0];
      pVVar15[local_588].m_data[1] = dVar42 + dVar24;
      pVVar15[local_588].m_data[2] = local_550 + pVVar15[local_588].m_data[2];
      dVar24 = pVVar15[local_5c0].m_data[1];
      pVVar15[local_5c0].m_data[0] = dVar38 + pVVar15[local_5c0].m_data[0];
      pVVar15[local_5c0].m_data[1] = dVar42 + dVar24;
      pVVar15[local_5c0].m_data[2] = local_550 + pVVar15[local_5c0].m_data[2];
      auVar26._0_8_ = dVar38 * dVar38;
      auVar26._8_8_ = dVar42 * dVar42;
      pGVar3 = (this->m_graph).m_vertices.
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar23 = vshufpd_avx(auVar26,auVar26,1);
      auVar23 = vfmadd231sd_fma(auVar23,local_518,local_518);
      auVar23 = vfmadd231sd_fma(auVar23,auVar5,auVar5);
      auVar23 = vsqrtsd_avx(auVar23,auVar23);
      dVar24 = auVar23._0_8_;
      *(double *)((long)(pGVar3->m_edges).m_data0 + lVar22 + -0x20) = dVar24;
      this->m_area = dVar24 + this->m_area;
      if ((dVar24 != 0.0) || (NAN(dVar24))) {
        auVar30._8_8_ = dVar24;
        auVar30._0_8_ = dVar24;
        local_550 = local_550 / dVar24;
        local_518 = vdivpd_avx(local_518,auVar30);
      }
      lVar20 = local_588 << 0x20;
      dVar24 = (double)(lVar20 + uVar16);
      if (local_588 < uVar16) {
        dVar24 = (double)((uVar16 << 0x20) + local_588);
      }
      local_598 = dVar21;
      local_578 = local_518;
      local_568 = local_550;
      local_528 = lVar19;
      local_5b8._0_8_ = dVar24;
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(pGVar3->m_edges).m_data0 + lVar22 + -0x10),(unsigned_long_long *)local_5b8)
      ;
      local_5b8._0_8_ = (local_5c0 << 0x20) + uVar12;
      if (local_5c0 < uVar12) {
        local_5b8._0_8_ = lVar20 + local_5c0;
      }
      local_530 = lVar22;
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(((this->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                 lVar22 + -0x10),(unsigned_long_long *)local_5b8);
      lVar22 = local_530;
      local_5b8._0_8_ = (uVar16 << 0x20) + local_5c0;
      if (local_5a0 < local_5c0) {
        local_5b8._0_8_ = (local_5c0 << 0x20) + local_5a0;
      }
      SArray<unsigned_long_long,_16UL>::Insert
                ((SArray<unsigned_long_long,_16UL> *)
                 ((long)(((this->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                 local_530 + -0x10),(unsigned_long_long *)local_5b8);
      lVar19 = local_528;
      uVar16 = local_590;
      dVar21 = local_598;
      if (this->m_addFacesPoints == true) {
        pVVar15 = this->m_faceNormals;
        puVar1 = (undefined8 *)((long)pVVar15->m_data + local_528 + -0x10);
        *puVar1 = local_518._0_8_;
        puVar1[1] = local_518._8_8_;
        *(double *)((long)pVVar15->m_data + local_528) = local_550;
        pVVar15 = this->m_points;
        pVVar4 = this->m_facePoints;
        dVar24 = pVVar15->m_data[local_538 + 2];
        dVar38 = pVVar15->m_data[local_540 + 2];
        dVar42 = pVVar15->m_data[local_548 + 2];
        auVar31._0_8_ =
             pVVar15->m_data[local_538] + pVVar15->m_data[local_540] + pVVar15->m_data[local_548];
        auVar31._8_8_ =
             (pVVar15->m_data + local_538)[1] + (pVVar15->m_data + local_540)[1] +
             (pVVar15->m_data + local_548)[1];
        auVar10._8_8_ = uStack_4b0;
        auVar10._0_8_ = local_4b8;
        auVar23 = vdivpd_avx(auVar31,auVar10);
        *(undefined1 (*) [16])((long)pVVar4->m_data + local_528 + -0x10) = auVar23;
        *(double *)((long)pVVar4->m_data + local_528) = (dVar24 + dVar38 + dVar42) / 3.0;
        local_5b8._8_8_ = 0;
        local_5b8._0_8_ = local_590;
        local_5b8._16_2_ = 0x100;
        SArray<HACD::DPoint,_16UL>::PushBack
                  ((SArray<HACD::DPoint,_16UL> *)
                   ((long)(this->m_graph).m_vertices.
                          super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar22 + -0x1b0),
                   (DPoint *)local_5b8);
      }
      dVar24 = (double)this->m_nTriangles;
      dVar21 = (double)((long)dVar21 + 1);
      lVar19 = lVar19 + 0x18;
      uVar16 = uVar16 - 1;
      lVar22 = lVar22 + 0x310;
    } while ((ulong)dVar21 < (ulong)dVar24);
  }
  if (this->m_addExtraDistPoints != false) {
    if (this->m_callBack != (CallBackFunction)0x0) {
      (*this->m_callBack)("++ Also adding distance points\n",0.0,0.0,0);
      dVar24 = (double)this->m_nTriangles;
    }
    uVar16 = local_588;
    if (0 < (long)dVar24) {
      lVar19 = 0x10;
      lVar22 = 0;
      local_590 = 200;
      local_5a0 = local_5a0 * 3;
      local_598 = -1.0;
      local_588 = 0x4008000000000000;
      uStack_580 = 0x4008000000000000;
      do {
        pVVar15 = this->m_points;
        auVar32._0_8_ =
             pVVar15->m_data[local_5a0] + pVVar15[uVar16].m_data[0] + pVVar15[local_5c0].m_data[0];
        auVar32._8_8_ =
             (pVVar15->m_data + local_5a0)[1] + pVVar15[uVar16].m_data[1] +
             pVVar15[local_5c0].m_data[1];
        auVar9._8_8_ = uStack_580;
        auVar9._0_8_ = local_588;
        local_5b8._0_16_ = vdivpd_avx(auVar32,auVar9);
        local_5b8._16_8_ =
             (pVVar15->m_data[local_5a0 + 2] + pVVar15[uVar16].m_data[2] +
             pVVar15[local_5c0].m_data[2]) / 3.0;
        auVar27._0_8_ = -local_568;
        auVar27._8_8_ = 0x8000000000000000;
        local_578._8_8_ = -(double)local_578._8_8_;
        local_578._0_8_ = -(double)local_578._0_8_;
        local_568 = (double)vmovlpd_avx(auVar27);
        bVar11 = RaycastMesh::Raycast
                           (&local_4a0,(Vec3<double> *)local_5b8,(Vec3<double> *)local_578,
                            (long *)&local_520,&local_4a8,&local_4d0,&local_4e8);
        dVar21 = dVar24;
        if (bVar11) {
          dVar21 = local_520;
        }
        dVar24 = (double)this->m_nTriangles;
        if ((ulong)dVar21 < (ulong)dVar24) {
          pVVar15 = this->m_extraDistPoints;
          *(double *)((long)pVVar15->m_data + lVar19 + -0x10) = local_4d0.m_data[0];
          *(double *)((long)pVVar15->m_data + lVar19 + -8) = local_4d0.m_data[1];
          *(double *)((long)pVVar15->m_data + lVar19) = local_4d0.m_data[2];
          pVVar15 = this->m_extraDistNormals;
          *(double *)((long)pVVar15->m_data + lVar19 + -0x10) = local_4e8.m_data[0];
          *(double *)((long)pVVar15->m_data + lVar19 + -8) = local_4e8.m_data[1];
          *(double *)((long)pVVar15->m_data + lVar19) = local_4e8.m_data[2];
          local_500.m_name = this->m_nPoints + lVar22;
          local_500.m_dist = 0.0;
          local_500.m_computed = false;
          local_500.m_distOnly = true;
          SArray<HACD::DPoint,_16UL>::PushBack
                    ((SArray<HACD::DPoint,_16UL> *)
                     ((long)(((this->m_graph).m_vertices.
                              super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_edges).m_data0 +
                     (local_590 - 0x10)),&local_500);
          dVar24 = (double)this->m_nTriangles;
        }
        lVar22 = lVar22 + 1;
        auVar23 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,dVar24);
        dVar21 = ((double)lVar22 * 100.0) / auVar23._0_8_;
        auVar8._8_8_ = 0x7fffffffffffffff;
        auVar8._0_8_ = 0x7fffffffffffffff;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar21 - local_598;
        auVar23 = vandpd_avx512vl(auVar33,auVar8);
        if ((1.0 < auVar23._0_8_) && (this->m_callBack != (CallBackFunction)0x0)) {
          sprintf(local_438,"%3.2f %% \t \t \r");
          (*this->m_callBack)(local_438,dVar21,0.0,this->m_nTriangles);
          dVar24 = (double)this->m_nTriangles;
          local_598 = dVar21;
        }
        local_590 = local_590 + 0x310;
        lVar19 = lVar19 + 0x18;
      } while (lVar22 < (long)dVar24);
    }
  }
  sVar18 = this->m_nPoints;
  if (sVar18 != 0) {
    pdVar17 = this->m_normals->m_data + 2;
    do {
      auVar23 = *(undefined1 (*) [16])((Vec3<double> *)(pdVar17 + -2))->m_data;
      auVar35._0_8_ = auVar23._0_8_ * auVar23._0_8_;
      auVar35._8_8_ = auVar23._8_8_ * auVar23._8_8_;
      auVar5 = vshufpd_avx(auVar35,auVar35,1);
      dVar24 = *pdVar17;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar24;
      auVar5 = vfmadd231sd_fma(auVar5,auVar23,auVar23);
      auVar5 = vfmadd231sd_fma(auVar5,auVar36,auVar36);
      auVar5 = vsqrtsd_avx(auVar5,auVar5);
      dVar21 = auVar5._0_8_;
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        auVar41._8_8_ = dVar21;
        auVar41._0_8_ = dVar21;
        auVar23 = vdivpd_avx(auVar23,auVar41);
        *(undefined1 (*) [16])((Vec3<double> *)(pdVar17 + -2))->m_data = auVar23;
        *pdVar17 = dVar24 / dVar21;
      }
      pdVar17 = pdVar17 + 3;
      sVar18 = sVar18 - 1;
    } while (sVar18 != 0);
  }
  RaycastMesh::~RaycastMesh(&local_4a0);
  return;
}

Assistant:

void HACD::InitializeDualGraph()
    {
        long i, j, k;
        Vec3<Real> u, v, w, normal;
		delete [] m_normals;
		m_normals = new Vec3<Real>[m_nPoints];
        if (m_addFacesPoints)
        {
            delete [] m_facePoints;
            delete [] m_faceNormals;
            
			m_facePoints = new Vec3<Real>[m_nTriangles];
            m_faceNormals = new Vec3<Real>[m_nTriangles];
/*
            m_facePoints = new Vec3<Real>[4*m_nTriangles];
            m_faceNormals = new Vec3<Real>[4*m_nTriangles];
*/
        }
		memset(m_normals, 0, sizeof(Vec3<Real>) * m_nPoints);

        RaycastMesh rm;
        if (m_addExtraDistPoints)
        {
            rm.Initialize(m_nPoints, m_nTriangles, m_points, m_triangles, 15);
            m_extraDistPoints = new Vec3<Real>[m_nTriangles];
            m_extraDistNormals = new Vec3<Real>[m_nTriangles];
        }
        double progressOld = -1.0;
        double progress = 0.0;
		char msg[1024];
		double ptgStep = 1.0;
		m_area = 0.0;				
		for(unsigned long f = 0; f < m_nTriangles; f++)
        {
            progress = f * 100.0 / m_nTriangles;
            if (fabs(progress-progressOld) > ptgStep && m_callBack)
            {
				sprintf(msg, "%3.2f %% \t \t \r", progress);
				(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
                progressOld = progress;
            }

			i = m_triangles[f].X();
            j = m_triangles[f].Y();
            k = m_triangles[f].Z();
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(i, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(j, 0, false, false));
			m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(k, 0, false, false));
            
            ICHUll  * ch = new ICHUll(m_heapManager);
            m_graph.m_vertices[f].m_convexHull = ch;
            ch->AddPoint(m_points[i], i);
            ch->AddPoint(m_points[j], j);
            ch->AddPoint(m_points[k], k);
			ch->SetDistPoints(0);

			u = m_points[j] - m_points[i];
			v = m_points[k] - m_points[i];
			w = m_points[k] - m_points[j];
			normal = u ^ v;

			m_normals[i] += normal;
			m_normals[j] += normal;
			m_normals[k] += normal;

			m_graph.m_vertices[f].m_surf = normal.GetNorm();
			m_area += m_graph.m_vertices[f].m_surf;
            normal.Normalize();
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(i,j));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(j,k));
			m_graph.m_vertices[f].m_boudaryEdges.Insert(GetEdgeIndex(k,i));
            if(m_addFacesPoints)
            {
                m_faceNormals[f] = normal;
                m_facePoints[f] = (m_points[i] + m_points[j] + m_points[k]) / 3.0;
				m_graph.m_vertices[f].m_distPoints.PushBack(DPoint(-static_cast<long>(f)-1, 0, false, true));
            }
        }

		// Now we have all the points in the KD tree, optimize the distance points insertion by running them in parallel
		// if possible. 
		if (m_addExtraDistPoints)	
        {
			if (m_callBack)
				(*m_callBack)("++ Also adding distance points\n", 0.0, 0.0, 0);

	        progressOld = -1.0;
			progress = 0.0;
			long completed = 0;

#ifdef THREAD_DIST_POINTS
#pragma omp parallel for
#endif
			for(long f = 0; f < (long)m_nTriangles; f++)
			{
				Vec3<Real> seedPoint((m_points[i] + m_points[j] + m_points[k]) / 3.0);
				Vec3<Real> hitPoint;
				Vec3<Real> hitNormal;
				normal = -normal;
                size_t faceIndex = m_nTriangles;

				Float dist;
				long hitTriangle;
				if (rm.Raycast(seedPoint,normal,hitTriangle,dist, hitPoint, hitNormal))
				{
					faceIndex = hitTriangle;
				}

                if (faceIndex < m_nTriangles )
                {
					m_extraDistPoints[f] = hitPoint;
					m_extraDistNormals[f] = hitNormal;
					m_graph.m_vertices[f].m_distPoints.PushBack(DPoint((long)(m_nPoints+f), 0, false, true));
				}

				// Atomic update of the progress
				#ifdef THREAD_DIST_POINTS
				#pragma omp critical
				#endif
				{
					completed++;
				
					progress = completed * 100.0 / m_nTriangles;
					if (fabs(progress-progressOld) > ptgStep && m_callBack)
					{
						sprintf(msg, "%3.2f %% \t \t \r", progress);
						(*m_callBack)(msg, progress, 0.0,  m_nTriangles);
						progressOld = progress;
					}
				}        
			}
		}

        for (size_t v = 0; v < m_nPoints; v++) 
		{
			m_normals[v].Normalize();
		}
    }